

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O3

char * __thiscall rapidxml::memory_pool<char>::allocate_raw(memory_pool<char> *this,size_t size)

{
  char *pcVar1;
  
  if (this->m_alloc_function == (alloc_function *)0x0) {
    pcVar1 = (char *)operator_new__(size);
    return pcVar1;
  }
  pcVar1 = (char *)(*this->m_alloc_function)(size);
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  __assert_fail("memory",
                "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/arbiter/third/xml/rapidxml.hpp"
                ,0x262,"char *rapidxml::memory_pool<>::allocate_raw(std::size_t) [Ch = char]");
}

Assistant:

char *allocate_raw(std::size_t size)
        {
            // Allocate
            void *memory;
            if (m_alloc_function)   // Allocate memory using either user-specified allocation function or global operator new[]
            {
                memory = m_alloc_function(size);
                assert(memory); // Allocator is not allowed to return 0, on failure it must either throw, stop the program or use longjmp
            }
            else
            {
                memory = new char[size];
#ifdef RAPIDXML_NO_EXCEPTIONS
                if (!memory)            // If exceptions are disabled, verify memory allocation, because new will not be able to throw bad_alloc
                    RAPIDXML_PARSE_ERROR("out of memory", 0);
#endif
            }
            return static_cast<char *>(memory);
        }